

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

unsigned_long * __thiscall
kj::Vector<unsigned_long>::add<unsigned_long>(Vector<unsigned_long> *this,unsigned_long *params)

{
  unsigned_long *puVar1;
  
  puVar1 = (this->builder).pos;
  if (puVar1 == (this->builder).endPtr) {
    grow(this,0);
    puVar1 = (this->builder).pos;
  }
  *puVar1 = *params;
  (this->builder).pos = puVar1 + 1;
  return puVar1;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }